

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)303>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 *nn;
  ModelDescription *pMVar3;
  ValidationPolicy validationPolicy;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputBlobNames;
  ValidationPolicy local_7c;
  Result local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  ValidationPolicy::ValidationPolicy(&local_7c,MLModelType_neuralNetworkRegressor);
  pMVar3 = format->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface(&local_78,pMVar3,format->specificationversion_,&local_7c);
  bVar2 = Result::good(&local_78);
  if (bVar2) {
    local_50._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_50._M_impl.super__Rb_tree_header._M_header;
    local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar3 = format->description_;
    if (pMVar3 == (ModelDescription *)0x0) {
      pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    if (format->_oneof_case_[0] == 0x12f) {
      nn = (undefined1 *)(format->Type_).neuralnetworkregressor_;
    }
    else {
      nn = Specification::_NeuralNetworkRegressor_default_instance_;
    }
    local_50._M_impl.super__Rb_tree_header._M_header._M_right =
         local_50._M_impl.super__Rb_tree_header._M_header._M_left;
    validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkRegressor>
              (__return_storage_ptr__,pMVar3,(NeuralNetworkRegressor *)nn,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_50,format->isupdatable_,&local_7c);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
      operator_delete(local_78.m_message._M_dataplus._M_p,
                      local_78.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __return_storage_ptr__->m_type = local_78.m_type;
    __return_storage_ptr__->m_reason = local_78.m_reason;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_message._M_dataplus._M_p == &local_78.m_message.field_2) {
      paVar1->_M_allocated_capacity = local_78.m_message.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
           local_78.m_message.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_78.m_message._M_dataplus._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_78.m_message.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_78.m_message._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_neuralNetworkRegressor>(const Specification::Model& format) {
        auto validationPolicy = ValidationPolicy(MLModelType_neuralNetworkRegressor);

        // must have regressor parameters
        Result r = validateRegressorInterface(format.description(), format.specificationversion(), validationPolicy);
        if (!r.good()) {
            return r;
        }

        std::set<std::string> outputBlobNames;
        return validateNeuralNetworkTopLevel(format.description(), format.neuralnetworkregressor(), outputBlobNames, format.isupdatable(), validationPolicy);
    }